

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_logger_fct.h
# Opt level: O1

void custlog__on_test_suite_end(fct_logger_i *l,fct_logger_evt_t *e)

{
  fct_ts_t *ts;
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  
  ts = e->ts;
  sVar3 = fct_ts__tst_cnt(ts);
  sVar4 = fct_ts__tst_cnt(ts);
  fct_ts__duration(ts);
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x53f
                  ,"size_t fct_ts__chk_cnt(const fct_ts_t *)");
  }
  sVar1 = (ts->test_list).used_itm_num;
  if (sVar1 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    sVar5 = 0;
    do {
      pvVar2 = (ts->test_list).itm_list[sVar5];
      if (pvVar2 == (void *)0x0) {
        __assert_fail("test != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x41b,"size_t fct_test__chk_cnt(const fct_test_t *)");
      }
      lVar6 = lVar6 + *(long *)((long)pvVar2 + 0x10) + *(long *)((long)pvVar2 + 0x28);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  printf("on_test_suite_end:\n    -          name: %s\n    -      duration: %f ms\n    -  tests passed: %d\n    -  tests failed: %d\n    -        checks: %lu\n"
         ,ts->name,sVar4 & 0xffffffff,(ulong)(uint)((int)sVar3 - (int)sVar4),lVar6);
  return;
}

Assistant:

static void
custlog__on_test_suite_end(fct_logger_i *l, fct_logger_evt_t const *e)
{
    fct_ts_t const *test_suite = e->ts;
    int test_cnt = fct_ts__tst_cnt(test_suite);
    int passed_test_cnt = fct_ts__tst_cnt(test_suite);
    int failed_test_cnt = test_cnt - passed_test_cnt;
    (void)l;
    printf("on_test_suite_end:\n"
           "    -          name: %s\n"
           "    -      duration: %f ms\n"
           "    -  tests passed: %d\n"
           "    -  tests failed: %d\n"
           "    -        checks: %lu\n",
           fct_ts__name(test_suite),
           fct_ts__duration(test_suite),
           passed_test_cnt,
           failed_test_cnt,
           (unsigned long) fct_ts__chk_cnt(test_suite)
          );
}